

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
          (DrawIndirectBase *this,GLboolean mapped,GLbitfield access,GLbitfield accessFlag,
          GLintptr offset,GLsizeiptr length)

{
  ostringstream *poVar1;
  long lVar2;
  GLboolean value;
  GLboolean extraout_DL;
  GLboolean extraout_DL_00;
  GLboolean extraout_DL_01;
  GLboolean value_00;
  GLbitfield access_00;
  GLbitfield extraout_EDX;
  GLbitfield extraout_EDX_00;
  GLbitfield extraout_EDX_01;
  GLbitfield access_01;
  CallLogWrapper *this_00;
  int v;
  DIResult result;
  uint local_384;
  string local_380;
  string local_360;
  GLsizeiptr local_340;
  undefined1 local_338 [384];
  undefined1 local_1b8 [384];
  long local_38;
  
  local_1b8[0] = false;
  local_340 = length;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
  local_38 = 0;
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x88bb,(GLint *)&local_384);
  if (local_384 != access) {
    local_38 = -1;
    poVar1 = (ostringstream *)(local_338 + 8);
    local_338[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_338,
               (char (*) [68])"glGetBufferParameteriv(GL_BUFFER_ACCESS) returned incorrect state: ")
    ;
    glcts::(anonymous_namespace)::DrawIndirectBase::AccessToString_abi_cxx11_
              (&local_360,(DrawIndirectBase *)(ulong)local_384,access_00);
    access_01 = extraout_EDX;
    if (local_338[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_360._M_dataplus._M_p,local_360._M_string_length);
      access_01 = extraout_EDX_00;
    }
    if (((byte)local_338[0] & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
      access_01 = extraout_EDX_01;
    }
    glcts::(anonymous_namespace)::DrawIndirectBase::AccessToString_abi_cxx11_
              (&local_380,(DrawIndirectBase *)(ulong)access,access_01);
    if (local_338[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_380._M_dataplus._M_p,local_380._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    DILogger::~DILogger((DILogger *)local_338);
  }
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x911f,(GLint *)&local_384);
  if (local_384 != accessFlag) {
    local_38 = -1;
    poVar1 = (ostringstream *)(local_338 + 8);
    local_338[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_338,
               (char (*) [74])
               "glGetBufferParameteriv(GL_BUFFER_ACCESS_FLAGS) returned incorrect state: ");
    if (local_338[0] == (DILogger)0x0) {
      std::ostream::operator<<(poVar1,local_384);
    }
    if (((byte)local_338[0] & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    }
    if (((byte)local_338[0] & 1) == 0) {
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    }
    DILogger::~DILogger((DILogger *)local_338);
  }
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x88bc,(GLint *)&local_384);
  if (local_384 != mapped) {
    local_38 = -1;
    poVar1 = (ostringstream *)(local_338 + 8);
    local_338[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_338,
               (char (*) [68])"glGetBufferParameteriv(GL_BUFFER_MAPPED) returned incorrect state: ")
    ;
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              (&local_360,(DrawIndirectBase *)(ulong)(byte)local_384,value);
    value_00 = extraout_DL;
    if (local_338[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_360._M_dataplus._M_p,local_360._M_string_length);
      value_00 = extraout_DL_00;
    }
    if (((byte)local_338[0] & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
      value_00 = extraout_DL_01;
    }
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              (&local_380,(DrawIndirectBase *)(ulong)(access & 0xff),value_00);
    if (local_338[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_380._M_dataplus._M_p,local_380._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    DILogger::~DILogger((DILogger *)local_338);
  }
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x9121,(GLint *)&local_384);
  if ((int)local_384 != offset) {
    local_38 = -1;
    poVar1 = (ostringstream *)(local_338 + 8);
    local_338[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_338,
               (char (*) [73])
               "glGetBufferParameteriv(GL_BUFFER_MAP_OFFSET) returned incorrect offset: ");
    if (local_338[0] == (DILogger)0x0) {
      std::ostream::operator<<(poVar1,local_384);
    }
    if (((byte)local_338[0] & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    }
    if (((byte)local_338[0] & 1) == 0) {
      std::ostream::_M_insert<long>((long)poVar1);
    }
    DILogger::~DILogger((DILogger *)local_338);
  }
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x9120,(GLint *)&local_384);
  if ((int)local_384 != local_340) {
    local_38 = -1;
    poVar1 = (ostringstream *)(local_338 + 8);
    local_338[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_338,
               (char (*) [73])
               "glGetBufferParameteriv(GL_BUFFER_MAP_LENGTH) returned incorrect length: ");
    if (local_338[0] == (DILogger)0x0) {
      std::ostream::operator<<(poVar1,local_384);
    }
    if (((byte)local_338[0] & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    }
    if (((byte)local_338[0] & 1) == 0) {
      std::ostream::_M_insert<long>((long)poVar1);
    }
    DILogger::~DILogger((DILogger *)local_338);
  }
  lVar2 = local_38;
  DILogger::~DILogger((DILogger *)local_1b8);
  return lVar2;
}

Assistant:

long StateValidate(GLboolean mapped, GLbitfield access, GLbitfield accessFlag, GLintptr offset, GLsizeiptr length)
	{
		DIResult result;

		if (!api::isES())
		{
			int v;
			glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_ACCESS, &v);
			if (v != static_cast<int>(access))
			{
				result.error() << "glGetBufferParameteriv(GL_BUFFER_ACCESS) returned incorrect state: "
							   << AccessToString(v) << ", expected: " << AccessToString(access);
			}
		}

		int v;
		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_ACCESS_FLAGS, &v);
		if (v != static_cast<int>(accessFlag))
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_ACCESS_FLAGS) returned incorrect state: " << v
						   << ", expected: " << accessFlag;
		}

		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAPPED, &v);
		if (v != mapped)
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_MAPPED) returned incorrect state: "
						   << BoolToString((GLboolean)v) << ", expected: " << BoolToString((GLboolean)access);
		}

		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_OFFSET, &v);
		if (v != offset)
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_MAP_OFFSET) returned incorrect offset: " << v
						   << ", expected: " << offset;
		}

		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_LENGTH, &v);
		if (v != length)
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_MAP_LENGTH) returned incorrect length: " << v
						   << ", expected: " << length;
		}

		return result.code();
	}